

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdiagonal.c
# Opt level: O0

int sdominate(int n,NCformat *Astore)

{
  float fVar1;
  int iVar2;
  void *addr;
  int_t *addr_00;
  int_t *piVar3;
  float *pfVar4;
  int_t *piVar5;
  double local_60;
  double s;
  int local_50;
  int_t diag;
  int_t j;
  int_t i;
  int_t *rowind_new;
  float *nzval_new;
  int fill;
  int_t nnz;
  int_t *colptr;
  int_t *rowind;
  float *nzval;
  NCformat *Astore_local;
  int n_local;
  
  addr = Astore->nzval;
  addr_00 = Astore->rowind;
  piVar3 = Astore->colptr;
  iVar2 = piVar3[n];
  nzval_new._0_4_ = 0;
  for (diag = 0; diag < n; diag = diag + 1) {
    s._4_4_ = -1;
    for (local_50 = piVar3[diag]; local_50 < piVar3[diag + 1]; local_50 = local_50 + 1) {
      if (addr_00[local_50] == diag) {
        s._4_4_ = local_50;
      }
    }
    if (s._4_4_ < 0) {
      nzval_new._0_4_ = (int)nzval_new + 1;
    }
  }
  if ((int)nzval_new == 0) {
    for (diag = 0; diag < n; diag = diag + 1) {
      local_60 = 1e-06;
      s._4_4_ = -1;
      for (local_50 = piVar3[diag]; local_50 < piVar3[diag + 1]; local_50 = local_50 + 1) {
        if (addr_00[local_50] == diag) {
          s._4_4_ = local_50;
        }
        local_60 = ABS((double)*(float *)((long)addr + (long)local_50 * 4)) + local_60;
      }
      *(float *)((long)addr + (long)s._4_4_ * 4) = (float)(local_60 * 3.0);
    }
  }
  else {
    pfVar4 = floatMalloc((long)(iVar2 + (int)nzval_new));
    piVar5 = intMalloc(iVar2 + (int)nzval_new);
    nzval_new._0_4_ = 0;
    for (diag = 0; diag < n; diag = diag + 1) {
      local_60 = 1e-06;
      s._4_4_ = -1;
      for (local_50 = piVar3[diag] - (int)nzval_new; local_50 < piVar3[diag + 1];
          local_50 = local_50 + 1) {
        iVar2 = addr_00[local_50];
        piVar5[local_50 + (int)nzval_new] = iVar2;
        if (iVar2 == diag) {
          s._4_4_ = local_50;
        }
        fVar1 = *(float *)((long)addr + (long)local_50 * 4);
        pfVar4[local_50 + (int)nzval_new] = fVar1;
        local_60 = ABS((double)fVar1) + local_60;
      }
      if (s._4_4_ < 0) {
        piVar5[piVar3[diag + 1] + (int)nzval_new] = diag;
        pfVar4[piVar3[diag + 1] + (int)nzval_new] = (float)(local_60 * 3.0);
        nzval_new._0_4_ = (int)nzval_new + 1;
      }
      else {
        pfVar4[s._4_4_ + (int)nzval_new] = (float)(local_60 * 3.0);
      }
      piVar3[diag + 1] = (int)nzval_new + piVar3[diag + 1];
    }
    Astore->nzval = pfVar4;
    Astore->rowind = piVar5;
    superlu_free(addr);
    superlu_free(addr_00);
  }
  Astore->nnz = (int)nzval_new + Astore->nnz;
  return (int)nzval_new;
}

Assistant:

int sdominate(int n, NCformat *Astore)
/* make the matrix diagonally dominant */
{
    float *nzval = (float *)Astore->nzval;
    int_t *rowind = Astore->rowind;
    int_t *colptr = Astore->colptr;
    int_t nnz = colptr[n];
    int fill = 0;
    float *nzval_new;
    int_t *rowind_new;
    int_t i, j, diag;
    double s;

    for (i = 0; i < n; i++)
    {
	diag = -1;
	for (j = colptr[i]; j < colptr[i + 1]; j++)
	    if (rowind[j] == i) diag = j;
	if (diag < 0) fill++;
    }
    if (fill)
    {
	nzval_new = floatMalloc(nnz + fill);
	rowind_new = intMalloc(nnz+ fill);
	fill = 0;
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i] - fill; j < colptr[i + 1]; j++)
	    {
		if ((rowind_new[j + fill] = rowind[j]) == i) diag = j;
		s += fabs(nzval_new[j + fill] = nzval[j]);
	    }
	    if (diag >= 0) {
		nzval_new[diag+fill] = s * 3.0;
	    } else {
		rowind_new[colptr[i + 1] + fill] = i;
		nzval_new[colptr[i + 1] + fill] = s * 3.0;
		fill++;
	    }
	    colptr[i + 1] += fill;
	}
	Astore->nzval = nzval_new;
	Astore->rowind = rowind_new;
	SUPERLU_FREE(nzval);
	SUPERLU_FREE(rowind);
    }
    else
    {
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i]; j < colptr[i + 1]; j++)
	    {
		if (rowind[j] == i) diag = j;
		s += fabs(nzval[j]);
	    }
	    nzval[diag] = s * 3.0;
	}
    }
    Astore->nnz += fill;
    return fill;
}